

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBoxButton::paintEvent(QToolBoxButton *this,QPaintEvent *param_2)

{
  QStyle *pQVar1;
  QStyleOptionToolBox *in_RDI;
  long in_FS_OFFSET;
  QPainter *p;
  QPainter paint;
  QStyleOptionToolBox opt;
  QWidget *pQVar2;
  QStyleOptionToolBox *in_stack_ffffffffffffff50;
  QPainter *pQVar3;
  QToolBoxButton *this_00;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QWidgetData *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  QWidget *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_80,(QPaintDevice *)&(in_RDI->super_QStyleOption).rect);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QToolBoxButton *)&local_78;
  local_18 = pQVar2;
  QStyleOptionToolBox::QStyleOptionToolBox((QStyleOptionToolBox *)0x702d79);
  initStyleOption(this_00,in_stack_ffffffffffffff50);
  pQVar1 = QWidget::style(pQVar2);
  pQVar3 = (QPainter *)&local_80;
  pQVar2 = QWidget::parentWidget((QWidget *)0x702dab);
  (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,0x1a,this_00,pQVar3,pQVar2);
  QStyleOptionToolBox::~QStyleOptionToolBox(in_RDI);
  QPainter::~QPainter((QPainter *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBoxButton::paintEvent(QPaintEvent *)
{
    QPainter paint(this);
    QPainter *p = &paint;
    QStyleOptionToolBox opt;
    initStyleOption(&opt);
    style()->drawControl(QStyle::CE_ToolBoxTab, &opt, p, parentWidget());
}